

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::member_location_attribute_qualifier_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t index)

{
  uint32_t __val;
  uint32_t comp;
  uint local_3c;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __val = get_member_location(this,(type->super_IVariant).self.id,index,&local_3c);
  if (__val != 0xffffffff) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::to_string(&local_38,__val);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_38);
    if (local_3c - 1 < 0xfffffffe) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::to_string(&local_38,local_3c);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::member_location_attribute_qualifier(const SPIRType &type, uint32_t index)
{
	string quals;
	uint32_t comp;
	uint32_t locn = get_member_location(type.self, index, &comp);
	if (locn != k_unknown_location)
	{
		quals += "user(locn";
		quals += convert_to_string(locn);
		if (comp != k_unknown_component && comp != 0)
		{
			quals += "_";
			quals += convert_to_string(comp);
		}
		quals += ")";
	}
	return quals;
}